

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::Execute_CreateErrorHelper
               (JsRTSingleVarArgumentAction *errorData,ThreadContextTTD *executeContext,
               ScriptContext *ctx,EventKind eventKind,Var *res)

{
  bool bVar1;
  TTDVar origVar;
  RecyclableObject *this;
  ScriptContext *pSVar2;
  JavascriptLibrary *pJVar3;
  JavascriptError *pJVar4;
  RecyclableObject *__obj;
  Var message;
  Var *res_local;
  EventKind eventKind_local;
  ScriptContext *ctx_local;
  ThreadContextTTD *executeContext_local;
  JsRTSingleVarArgumentAction *errorData_local;
  
  origVar = GetVarItem_0<1ul>(errorData);
  __obj = (RecyclableObject *)InflateVarInReplay(executeContext,origVar);
  if (__obj != (RecyclableObject *)0x0) {
    bVar1 = Js::VarIs<Js::RecyclableObject>(__obj);
    if (bVar1) {
      this = Js::VarTo<Js::RecyclableObject>(__obj);
      pSVar2 = Js::RecyclableObject::GetScriptContext(this);
      if (pSVar2 != ctx) {
        __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(ctx,this,false);
      }
    }
    *res = (Var)0x0;
    switch(eventKind) {
    case CreateErrorActionTag:
      pJVar3 = Js::ScriptContext::GetLibrary(ctx);
      pJVar4 = Js::JavascriptLibrary::CreateError(pJVar3);
      *res = pJVar4;
      break;
    case CreateRangeErrorActionTag:
      pJVar3 = Js::ScriptContext::GetLibrary(ctx);
      pJVar4 = Js::JavascriptLibrary::CreateRangeError(pJVar3);
      *res = pJVar4;
      break;
    case CreateReferenceErrorActionTag:
      pJVar3 = Js::ScriptContext::GetLibrary(ctx);
      pJVar4 = Js::JavascriptLibrary::CreateReferenceError(pJVar3);
      *res = pJVar4;
      break;
    case CreateSyntaxErrorActionTag:
      pJVar3 = Js::ScriptContext::GetLibrary(ctx);
      pJVar4 = Js::JavascriptLibrary::CreateSyntaxError(pJVar3);
      *res = pJVar4;
      break;
    case CreateTypeErrorActionTag:
      pJVar3 = Js::ScriptContext::GetLibrary(ctx);
      pJVar4 = Js::JavascriptLibrary::CreateTypeError(pJVar3);
      *res = pJVar4;
      break;
    case CreateURIErrorActionTag:
      pJVar3 = Js::ScriptContext::GetLibrary(ctx);
      pJVar4 = Js::JavascriptLibrary::CreateURIError(pJVar3);
      *res = pJVar4;
      break;
    default:
      TTDAbort_unrecoverable_error("Missing error kind!!!");
    }
    Js::JavascriptOperators::OP_SetProperty
              (*res,0x102,__obj,ctx,(PropertyValueInfo *)0x0,PropertyOperation_None,(Var)0x0);
  }
  return;
}

Assistant:

void Execute_CreateErrorHelper(const JsRTSingleVarArgumentAction* errorData, ThreadContextTTD* executeContext, Js::ScriptContext* ctx, EventKind eventKind, Js::Var* res)
        {
            Js::Var message = InflateVarInReplay(executeContext, GetVarItem_0(errorData));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(message, ctx);

            *res = nullptr;
            switch(eventKind)
            {
            case EventKind::CreateErrorActionTag:
                *res = ctx->GetLibrary()->CreateError();
                break;
            case EventKind::CreateRangeErrorActionTag:
                *res = ctx->GetLibrary()->CreateRangeError();
                break;
            case EventKind::CreateReferenceErrorActionTag:
                *res = ctx->GetLibrary()->CreateReferenceError();
                break;
            case EventKind::CreateSyntaxErrorActionTag:
                *res = ctx->GetLibrary()->CreateSyntaxError();
                break;
            case EventKind::CreateTypeErrorActionTag:
                *res = ctx->GetLibrary()->CreateTypeError();
                break;
            case EventKind::CreateURIErrorActionTag:
                *res = ctx->GetLibrary()->CreateURIError();
                break;
            default:
                TTDAssert(false, "Missing error kind!!!");
            }

            Js::JavascriptOperators::OP_SetProperty(*res, Js::PropertyIds::message, message, ctx);
        }